

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midi_timidity.cpp
# Opt level: O2

int __thiscall
TimidityPPMIDIDevice::Open
          (TimidityPPMIDIDevice *this,_func_void_uint_void_ptr_DWORD_DWORD *callback,void *userdata)

{
  FString *this_00;
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  char *tail;
  
  iVar5 = timidity_frequency.Value;
  iVar4 = timidity_pipe.Value;
  bVar3 = timidity_8bit.Value;
  bVar2 = timidity_stereo.Value;
  iVar6 = pipe(this->WavePipe);
  if (iVar6 == -1) {
    Printf(200,"Could not create a data pipe for TiMidity++.\n");
  }
  else {
    iVar6 = (*GSnd->_vptr_SoundRenderer[0xb])
                      (GSnd,FillStream,
                       (ulong)(uint)((iVar5 * iVar4) / 1000 << (!bVar3 + bVar2 & 0x1fU)),
                       (ulong)((timidity_stereo.Value ^ 1) + (uint)timidity_8bit.Value * 2),
                       (ulong)(uint)timidity_frequency.Value,this);
    (this->super_PseudoMIDIDevice).Stream = (SoundStream *)CONCAT44(extraout_var,iVar6);
    if ((SoundStream *)CONCAT44(extraout_var,iVar6) == (SoundStream *)0x0) {
      Printf(200,"Could not create music stream.\n");
      close(this->WavePipe[1]);
      close(this->WavePipe[0]);
      this->WavePipe[0] = -1;
      this->WavePipe[1] = -1;
    }
    else if (0x7ce < iVar5 * iVar4 + 999U) {
      tail = "-o - -Ors";
      goto LAB_0035ca53;
    }
  }
  Printf(200,
         "If your soundcard cannot play more than one\nwave at a time, you will hear no music.\n");
  tail = "-Od";
LAB_0035ca53:
  this_00 = &this->CommandLine;
  FString::operator+=(this_00,tail);
  cVar1 = 'M';
  if (timidity_stereo.Value != false) {
    cVar1 = 'S';
  }
  FString::operator+=(this_00,cVar1);
  cVar1 = '1';
  if (timidity_8bit.Value != false) {
    cVar1 = '8';
  }
  FString::operator+=(this_00,cVar1);
  if (timidity_byteswap.Value == true) {
    FString::operator+=(this_00,'x');
  }
  this->LoopPos = (ulong)*(uint *)((this->CommandLine).Chars + -0xc) + 4;
  FString::operator+=(this_00," -idl ");
  FString::operator+=(this_00,(this->DiskName).Name);
  return 0;
}

Assistant:

int TimidityPPMIDIDevice::Open(void (*callback)(unsigned int, void *, DWORD, DWORD), void *userdata)
{
	int pipeSize;

#ifdef _WIN32
	static SECURITY_ATTRIBUTES inheritable = { sizeof(inheritable), NULL, TRUE };
	
	if (!Validated && !ValidateTimidity ())
	{
		return 101;
	}

	Validated = true;
#endif // WIN32

	pipeSize = (timidity_pipe * timidity_frequency / 1000)
		<< (timidity_stereo + !timidity_8bit);

	{
#ifdef _WIN32
		// Round pipe size up to nearest power of 2 to try and avoid partial
		// buffer reads in FillStream() under NT. This does not seem to be an
		// issue under 9x.
		int bitmask = pipeSize & -pipeSize;
		
		while (bitmask < pipeSize)
			bitmask <<= 1;
		pipeSize = bitmask;

		if (!CreatePipe(&ReadWavePipe, &WriteWavePipe, &inheritable, pipeSize))
#else // WIN32
		if (pipe (WavePipe) == -1)
#endif
		{
			Printf(PRINT_BOLD, "Could not create a data pipe for TiMidity++.\n");
			pipeSize = 0;
		}
		else
		{
			Stream = GSnd->CreateStream(FillStream, pipeSize,
				(timidity_stereo ? 0 : SoundStream::Mono) |
				(timidity_8bit ? SoundStream::Bits8 : 0),
				timidity_frequency, this);
			if (Stream == NULL)
			{
				Printf(PRINT_BOLD, "Could not create music stream.\n");
				pipeSize = 0;
#ifdef _WIN32
				CloseHandle(WriteWavePipe);
				CloseHandle(ReadWavePipe);
				ReadWavePipe = WriteWavePipe = INVALID_HANDLE_VALUE;
#else
				close(WavePipe[1]);
				close(WavePipe[0]);
				WavePipe[0] = WavePipe[1] = -1;
#endif
			}
		}
		
		if (pipeSize == 0)
		{
			Printf(PRINT_BOLD, "If your soundcard cannot play more than one\n"
								"wave at a time, you will hear no music.\n");
		}
		else
		{
			CommandLine += "-o - -Ors";
		}
	}

	if (pipeSize == 0)
	{
		CommandLine += "-Od";
	}

	CommandLine += timidity_stereo ? 'S' : 'M';
	CommandLine += timidity_8bit ? '8' : '1';
	if (timidity_byteswap)
	{
		CommandLine += 'x';
	}

	LoopPos = CommandLine.Len() + 4;

	CommandLine += " -idl ";
	CommandLine += DiskName.GetName();
	return 0;
}